

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

float ImGui::TableGetHeaderRowHeight(void)

{
  float fVar1;
  ImGuiTable *pIVar2;
  ImGuiTableColumn *pIVar3;
  ImGuiContext *pIVar4;
  int iVar5;
  long lVar6;
  char *text;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  ImVec2 IVar10;
  float fVar11;
  
  pIVar4 = GImGui;
  pIVar2 = GImGui->CurrentTable;
  fVar11 = GImGui->FontSize;
  iVar5 = pIVar2->ColumnsCount;
  if (0 < iVar5) {
    lVar8 = 0;
    uVar7 = 0;
    do {
      if (((pIVar2->EnabledMaskByIndex[uVar7 >> 5 & 0x7ffffff] >> ((uint)uVar7 & 0x1f) & 1) != 0) &&
         (pIVar3 = (pIVar2->Columns).Data, (*(byte *)((long)&pIVar3->Flags + lVar8 + 1) & 0x10) == 0
         )) {
        if ((pIVar2->IsLayoutLocked != false) ||
           (text = "", (long)uVar7 < (long)pIVar2->DeclColumnsCount)) {
          lVar6 = (long)*(short *)((long)&pIVar3->NameOffset + lVar8);
          text = "";
          if (lVar6 != -1) {
            text = (pIVar2->ColumnsNames).Buf.Data + lVar6;
          }
        }
        IVar10 = CalcTextSize(text,(char *)0x0,false,-1.0);
        uVar9 = -(uint)(IVar10.y <= fVar11);
        fVar11 = (float)(uVar9 & (uint)fVar11 | ~uVar9 & (uint)IVar10.y);
        iVar5 = pIVar2->ColumnsCount;
      }
      uVar7 = uVar7 + 1;
      lVar8 = lVar8 + 0x70;
    } while ((long)uVar7 < (long)iVar5);
  }
  fVar1 = (pIVar4->Style).CellPadding.y;
  return fVar1 + fVar1 + fVar11;
}

Assistant:

float ImGui::TableGetHeaderRowHeight()
{
    // Caring for a minor edge case:
    // Calculate row height, for the unlikely case that some labels may be taller than others.
    // If we didn't do that, uneven header height would highlight but smaller one before the tallest wouldn't catch input for all height.
    // In your custom header row you may omit this all together and just call TableNextRow() without a height...
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    float row_height = g.FontSize;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        if (IM_BITARRAY_TESTBIT(table->EnabledMaskByIndex, column_n))
            if ((table->Columns[column_n].Flags & ImGuiTableColumnFlags_NoHeaderLabel) == 0)
                row_height = ImMax(row_height, CalcTextSize(TableGetColumnName(table, column_n)).y);
    return row_height + g.Style.CellPadding.y * 2.0f;
}